

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

CSVOption<char> duckdb::CSVOption<char>::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  if ((char)uVar1 == '\0') {
    uVar3 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (ushort)iVar2 & 0xff;
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
  uVar1 = (*deserializer->_vptr_Deserializer[0xd])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return (CSVOption<char>)(uVar3 | (ushort)((uVar1 & 0xff) << 8));
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}